

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Type>,wasm::Type>::
set<std::vector<wasm::Type,std::allocator<wasm::Type>>>
          (ArenaVectorBase<ArenaVector<wasm::Type>,wasm::Type> *this,
          vector<wasm::Type,_std::allocator<wasm::Type>_> *list)

{
  pointer pTVar1;
  void *pvVar2;
  pointer pTVar3;
  uintptr_t *puVar4;
  size_t size;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range2;
  ulong uVar5;
  
  size = (long)(list->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(list->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
  uVar5 = (long)size >> 3;
  if (*(ulong *)(this + 0x10) < uVar5) {
    *(ulong *)(this + 0x10) = uVar5;
    pvVar2 = MixedArena::allocSpace(*(MixedArena **)(this + 0x18),size,8);
    *(void **)this = pvVar2;
  }
  pTVar3 = (list->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (list->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar3 != pTVar1) {
    puVar4 = *(uintptr_t **)this;
    do {
      *puVar4 = pTVar3->id;
      pTVar3 = pTVar3 + 1;
      puVar4 = puVar4 + 1;
    } while (pTVar3 != pTVar1);
  }
  *(ulong *)(this + 8) = uVar5;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }